

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_data.cpp
# Opt level: O3

void __thiscall duckdb::ColumnData::InitializeScan(ColumnData *this,ColumnScanState *state)

{
  _Head_base<0UL,_duckdb::SegmentScanState_*,_false> _Var1;
  ColumnSegment *pCVar2;
  idx_t iVar3;
  
  pCVar2 = SegmentTree<duckdb::ColumnSegment,_false>::GetRootSegment
                     (&(this->data).super_SegmentTree<duckdb::ColumnSegment,_false>);
  state->current = pCVar2;
  state->segment_tree = &this->data;
  if (pCVar2 == (ColumnSegment *)0x0) {
    iVar3 = 0;
  }
  else {
    iVar3 = (pCVar2->super_SegmentBase<duckdb::ColumnSegment>).start;
  }
  state->row_index = iVar3;
  state->internal_index = iVar3;
  state->initialized = false;
  _Var1._M_head_impl =
       (state->scan_state).
       super_unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>_>.
       _M_t.
       super___uniq_ptr_impl<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::SegmentScanState_*,_std::default_delete<duckdb::SegmentScanState>_>
       .super__Head_base<0UL,_duckdb::SegmentScanState_*,_false>._M_head_impl;
  (state->scan_state).
  super_unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>_>._M_t.
  super___uniq_ptr_impl<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::SegmentScanState_*,_std::default_delete<duckdb::SegmentScanState>_>
  .super__Head_base<0UL,_duckdb::SegmentScanState_*,_false>._M_head_impl = (SegmentScanState *)0x0;
  if (_Var1._M_head_impl != (SegmentScanState *)0x0) {
    (*(_Var1._M_head_impl)->_vptr_SegmentScanState[1])();
  }
  state->last_offset = 0;
  return;
}

Assistant:

void ColumnData::InitializeScan(ColumnScanState &state) {
	state.current = data.GetRootSegment();
	state.segment_tree = &data;
	state.row_index = state.current ? state.current->start : 0;
	state.internal_index = state.row_index;
	state.initialized = false;
	state.scan_state.reset();
	state.last_offset = 0;
}